

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::AddMacOSXContentRule(cmGlobalNinjaGenerator *this)

{
  cmNinjaRule rule;
  string sStack_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  undefined1 local_138 [64];
  char local_f8 [32];
  char local_d8 [200];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"COPY_OSX_CONTENT",(allocator<char> *)&local_178);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_138,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  CMakeCmd_abi_cxx11_(&sStack_198,this);
  std::operator+(&local_178,&sStack_198," -E copy $in $out");
  std::__cxx11::string::operator=((string *)(local_138 + 0x20),(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&sStack_198);
  std::__cxx11::string::assign(local_f8);
  std::__cxx11::string::assign(local_d8);
  AddRule(this,(cmNinjaRule *)local_138);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_138);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddMacOSXContentRule()
{
  cmNinjaRule rule("COPY_OSX_CONTENT");
  rule.Command = CMakeCmd() + " -E copy $in $out";
  rule.Description = "Copying OS X Content $out";
  rule.Comment = "Rule for copying OS X bundle content file.";
  this->AddRule(rule);
}